

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O1

void __thiscall PRED<UF>::PerformLabelingWithSteps(PRED<UF> *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  long lVar3;
  mapped_type *pmVar4;
  double dVar5;
  string local_48;
  double local_28;
  
  local_28 = Alloc(this);
  lVar3 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar3;
  FirstScan(this);
  lVar3 = cv::getTickCount();
  dVar5 = (double)lVar3 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar5;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar5 + (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
               total;
  Step_abi_cxx11_(&local_48,FIRST_SCAN);
  dVar5 = ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last *
          1000.0) / (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                    tick_frequency_;
  this_00 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counters_;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
           ::operator[](this_00,&local_48);
  pmVar4->last = dVar5;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
           ::operator[](this_00,&local_48);
  pmVar4->total = dVar5 + pmVar4->total;
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  lVar3 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar3;
  SecondScan(this);
  lVar3 = cv::getTickCount();
  dVar5 = (double)lVar3 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar5;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar5 + (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
               total;
  Step_abi_cxx11_(&local_48,SECOND_SCAN);
  dVar5 = ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last *
          1000.0) / (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                    tick_frequency_;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
           ::operator[](this_00,&local_48);
  pmVar4->last = dVar5;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
           ::operator[](this_00,&local_48);
  pmVar4->total = dVar5 + pmVar4->total;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  lVar3 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar3;
  if (UF::P_ != (uint *)0x0) {
    operator_delete__(UF::P_);
  }
  lVar3 = cv::getTickCount();
  dVar5 = (double)lVar3 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar5;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar5 + (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
               total;
  Step_abi_cxx11_(&local_48,ALLOC_DEALLOC);
  dVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  dVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
           ::operator[](this_00,&local_48);
  local_28 = local_28 + (dVar5 * 1000.0) / dVar2;
  pmVar4->last = local_28;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
           ::operator[](this_00,&local_48);
  pmVar4->total = local_28 + pmVar4->total;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PerformLabelingWithSteps()
    {
        double alloc_timing = Alloc();

        perf_.start();
        FirstScan();
        perf_.stop();
        perf_.store(Step(StepType::FIRST_SCAN), perf_.last());

        perf_.start();
        SecondScan();
        perf_.stop();
        perf_.store(Step(StepType::SECOND_SCAN), perf_.last());

        perf_.start();
        Dealloc();
        perf_.stop();
        perf_.store(Step(StepType::ALLOC_DEALLOC), perf_.last() + alloc_timing);

    }